

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::FboUtil::FormatDB::addExtensionFormat
          (FormatDB *this,ImageFormat format,FormatFlags newFlags,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *requiredExtensions)

{
  mapped_type *pmVar1;
  _Rb_tree<deqp::gls::FboUtil::FormatDB::ExtensionInfo,deqp::gls::FboUtil::FormatDB::ExtensionInfo,std::_Identity<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>>
  *this_00;
  ExtensionInfo extensionRecord;
  ImageFormat local_60;
  ExtensionInfo local_58;
  
  local_60 = format;
  pmVar1 = std::
           map<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>_>
           ::operator[](&this->m_formatFlags,&local_60);
  *pmVar1 = *pmVar1 | newFlags;
  this_00 = (_Rb_tree<deqp::gls::FboUtil::FormatDB::ExtensionInfo,deqp::gls::FboUtil::FormatDB::ExtensionInfo,std::_Identity<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>>
             *)std::
               map<deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>_>_>_>
               ::operator[](&this->m_formatExtensions,&local_60);
  local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.flags = newFlags;
  local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58.requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_58.requiredExtensions._M_t,&requiredExtensions->_M_t);
  std::
  _Rb_tree<deqp::gls::FboUtil::FormatDB::ExtensionInfo,deqp::gls::FboUtil::FormatDB::ExtensionInfo,std::_Identity<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>>
  ::_M_insert_unique<deqp::gls::FboUtil::FormatDB::ExtensionInfo_const&>(this_00,&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_58.requiredExtensions._M_t);
  return;
}

Assistant:

void FormatDB::addExtensionFormat (ImageFormat format, FormatFlags newFlags, const std::set<std::string>& requiredExtensions)
{
	DE_ASSERT(!requiredExtensions.empty());

	{
		FormatFlags& flags = m_formatFlags[format];
		flags = FormatFlags(flags | newFlags);
	}

	{
		std::set<ExtensionInfo>&	extensionInfo	= m_formatExtensions[format];
		ExtensionInfo				extensionRecord;

		extensionRecord.flags				= newFlags;
		extensionRecord.requiredExtensions	= requiredExtensions;

		DE_ASSERT(!de::contains(extensionInfo, extensionRecord)); // extensions specified only once
		extensionInfo.insert(extensionRecord);
	}
}